

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

size_t encodeUTF8(char *s,uint ch)

{
  size_t sVar1;
  byte bVar2;
  
  bVar2 = (byte)ch;
  if (ch < 0x80) {
    *s = bVar2;
    sVar1 = 1;
  }
  else if (ch < 0x800) {
    *s = (byte)(ch >> 6) | 0xc0;
    s[1] = bVar2 & 0x3f | 0x80;
    sVar1 = 2;
  }
  else if (ch < 0x10000) {
    *s = (byte)(ch >> 0xc) | 0xe0;
    s[1] = (byte)(ch >> 6) & 0x3f | 0x80;
    s[2] = bVar2 & 0x3f | 0x80;
    sVar1 = 3;
  }
  else if (ch < 0x110000) {
    *s = (byte)(ch >> 0x12) | 0xf0;
    s[1] = (byte)(ch >> 0xc) & 0x3f | 0x80;
    s[2] = (byte)(ch >> 6) & 0x3f | 0x80;
    s[3] = bVar2 & 0x3f | 0x80;
    sVar1 = 4;
  }
  else {
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

static size_t encodeUTF8(char* s, unsigned int ch)
{
    size_t count = 0;

    if (ch < 0x80)
        s[count++] = (char) ch;
    else if (ch < 0x800)
    {
        s[count++] = (ch >> 6) | 0xc0;
        s[count++] = (ch & 0x3f) | 0x80;
    }
    else if (ch < 0x10000)
    {
        s[count++] = (ch >> 12) | 0xe0;
        s[count++] = ((ch >> 6) & 0x3f) | 0x80;
        s[count++] = (ch & 0x3f) | 0x80;
    }
    else if (ch < 0x110000)
    {
        s[count++] = (ch >> 18) | 0xf0;
        s[count++] = ((ch >> 12) & 0x3f) | 0x80;
        s[count++] = ((ch >> 6) & 0x3f) | 0x80;
        s[count++] = (ch & 0x3f) | 0x80;
    }

    return count;
}